

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
__thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
iterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::Literal*,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (SubstitutionTree<Indexing::LiteralClause> *this,Literal *query,bool retrieveSubstitutions
          ,bool reversed,AbstractingUnifier *args,AbstractionOracle args_1,bool args_2)

{
  long *plVar1;
  char cVar2;
  undefined7 in_register_00000011;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *p;
  undefined4 in_register_0000008c;
  undefined3 in_stack_00000009;
  bool in_stack_00000010;
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  local_50;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_40;
  
  plVar1 = *(long **)&(query->super_Term)._functor;
  if (plVar1 != (long *)0x0) {
    cVar2 = (**(code **)(*plVar1 + 0x18))();
    if (cVar2 == '\0') {
      Lib::
      Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
      ::
      Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>*,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
                ((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
                  *)&local_40,(SubstitutionTree<Indexing::LiteralClause> *)query,
                 *(Node **)&(query->super_Term)._functor,
                 (Literal *)CONCAT71(in_register_00000011,retrieveSubstitutions),reversed,
                 SUB81(args,0),(AbstractingUnifier *)CONCAT44(in_register_0000008c,args_1._mode),
                 _args_2,in_stack_00000010);
      Lib::
      iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
                (&local_50,(Lib *)&local_40,p);
      Lib::
      pvi<Lib::IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>>
                ((Lib *)this,&local_50);
      Lib::
      Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&local_50);
      Lib::
      Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_40);
      return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
              )(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
                *)this;
    }
  }
  Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>::
  getEmpty();
  return (VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
          )(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
            *)this;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }